

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

Instruction * __thiscall spvtools::opt::IRContext::KillInst(IRContext *this,Instruction *inst)

{
  Op op;
  TypeManager *this_00;
  ConstantManager *this_01;
  FeatureManager *__ptr;
  Instruction *pIVar1;
  DefUseManager *this_02;
  pointer pIVar2;
  bool bVar3;
  uint32_t uVar4;
  int32_t iVar5;
  Instruction *pIVar6;
  Instruction *l_inst;
  pointer inst_00;
  
  pIVar6 = (Instruction *)0x0;
  uVar4 = 0;
  if (inst != (Instruction *)0x0) {
    if (inst->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    }
    if (uVar4 != 0) {
      KillNamesAndDecorates(this,uVar4);
    }
    KillOperandFromDebugInstructions(this,inst);
    if ((this->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      this_02 = (this->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
      analysis::DefUseManager::ClearInst(this_02,inst);
      pIVar2 = (inst->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (inst_00 = (inst->dbg_line_insts_).
                     super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_start; inst_00 != pIVar2;
          inst_00 = inst_00 + 1) {
        analysis::DefUseManager::ClearInst(this_02,inst_00);
      }
    }
    if ((this->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      std::
      _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->instr_to_block_)._M_h);
    }
    if ((this->valid_analyses_ & kAnalysisDecorations) != kAnalysisNone) {
      bVar3 = spvOpcodeIsDecoration(inst->opcode_);
      if (bVar3) {
        analysis::DecorationManager::RemoveDecoration
                  ((this->decoration_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                   _M_head_impl,inst);
      }
    }
    if ((this->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone) {
      analysis::DebugInfoManager::ClearDebugScopeAndInlinedAtUses
                ((this->debug_info_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                 _M_head_impl,inst);
      if ((this->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
        BuildDebugInfoManager(this);
      }
      analysis::DebugInfoManager::ClearDebugInfo
                ((this->debug_info_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                 _M_head_impl,inst);
    }
    if ((this->type_mgr_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
        .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl !=
        (TypeManager *)0x0) {
      op = inst->opcode_;
      iVar5 = spvOpcodeGeneratesType(op);
      if ((op == OpTypeForwardPointer) || (iVar5 != 0)) {
        this_00 = (this->type_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl
        ;
        uVar4 = 0;
        if (inst->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
        }
        analysis::TypeManager::RemoveId(this_00,uVar4);
      }
    }
    if ((this->constant_mgr_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
        .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl !=
        (ConstantManager *)0x0) {
      iVar5 = spvOpcodeIsConstant(inst->opcode_);
      if (iVar5 != 0) {
        this_01 = (this->constant_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                  _M_head_impl;
        uVar4 = 0;
        if (inst->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
        }
        analysis::ConstantManager::RemoveId(this_01,uVar4);
      }
    }
    if ((inst->opcode_ == OpCapability) || (inst->opcode_ == OpExtension)) {
      __ptr = (this->feature_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
              .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      (this->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl =
           (FeatureManager *)0x0;
      if (__ptr != (FeatureManager *)0x0) {
        std::default_delete<spvtools::opt::FeatureManager>::operator()
                  ((default_delete<spvtools::opt::FeatureManager> *)&this->feature_mgr_,__ptr);
      }
    }
    RemoveFromIdToName(this,inst);
    pIVar1 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar1 == (Instruction *)0x0) {
      inst->opcode_ = OpNop;
      inst->has_type_id_ = false;
      inst->has_result_id_ = false;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase_at_end
                (&inst->operands_,
                 (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pIVar6 = (Instruction *)0x0;
    }
    else {
      pIVar6 = (Instruction *)0x0;
      if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
        pIVar6 = pIVar1;
      }
      if ((inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
        __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xca,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (((inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
      (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
      (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
      if (inst != (Instruction *)0x0) {
        (*(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])();
      }
    }
  }
  return pIVar6;
}

Assistant:

Instruction* IRContext::KillInst(Instruction* inst) {
  if (!inst) {
    return nullptr;
  }

  KillNamesAndDecorates(inst);

  KillOperandFromDebugInstructions(inst);

  if (AreAnalysesValid(kAnalysisDefUse)) {
    analysis::DefUseManager* def_use_mgr = get_def_use_mgr();
    def_use_mgr->ClearInst(inst);
    for (auto& l_inst : inst->dbg_line_insts()) def_use_mgr->ClearInst(&l_inst);
  }
  if (AreAnalysesValid(kAnalysisInstrToBlockMapping)) {
    instr_to_block_.erase(inst);
  }
  if (AreAnalysesValid(kAnalysisDecorations)) {
    if (inst->IsDecoration()) {
      decoration_mgr_->RemoveDecoration(inst);
    }
  }
  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->ClearDebugScopeAndInlinedAtUses(inst);
    get_debug_info_mgr()->ClearDebugInfo(inst);
  }
  if (type_mgr_ && IsTypeInst(inst->opcode())) {
    type_mgr_->RemoveId(inst->result_id());
  }
  if (constant_mgr_ && IsConstantInst(inst->opcode())) {
    constant_mgr_->RemoveId(inst->result_id());
  }
  if (inst->opcode() == spv::Op::OpCapability ||
      inst->opcode() == spv::Op::OpExtension) {
    // We reset the feature manager, instead of updating it, because it is just
    // as much work.  We would have to remove all capabilities implied by this
    // capability that are not also implied by the remaining OpCapability
    // instructions. We could update extensions, but we will see if it is
    // needed.
    ResetFeatureManager();
  }

  RemoveFromIdToName(inst);

  Instruction* next_instruction = nullptr;
  if (inst->IsInAList()) {
    next_instruction = inst->NextNode();
    inst->RemoveFromList();
    delete inst;
  } else {
    // Needed for instructions that are not part of a list like OpLabels,
    // OpFunction, OpFunctionEnd, etc..
    inst->ToNop();
  }
  return next_instruction;
}